

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall
CMU462::Matrix4x4::operator-(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this)

{
  double dVar1;
  double *pdVar2;
  Matrix4x4 *A;
  Matrix4x4 *this_local;
  Matrix4x4 *B;
  
  Matrix4x4(__return_storage_ptr__);
  pdVar2 = operator()(this,0,0);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,0,0);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,0,1);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,0,1);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,0,2);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,0,2);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,0,3);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,0,3);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,1,0);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,1,0);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,1,1);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,1,1);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,1,2);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,1,2);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,1,3);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,1,3);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,2,0);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,2,0);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,2,1);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,2,1);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,2,2);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,2,2);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,2,3);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,2,3);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,3,0);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,3,0);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,3,1);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,3,1);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,3,2);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,3,2);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,3,3);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,3,3);
  *pdVar2 = -dVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::operator-( void ) const {

  // returns -A (Negation).
  const Matrix4x4& A( *this );
  Matrix4x4 B;

  B(0,0) = -A(0,0); B(0,1) = -A(0,1); B(0,2) = -A(0,2); B(0,3) = -A(0,3);
  B(1,0) = -A(1,0); B(1,1) = -A(1,1); B(1,2) = -A(1,2); B(1,3) = -A(1,3);
  B(2,0) = -A(2,0); B(2,1) = -A(2,1); B(2,2) = -A(2,2); B(2,3) = -A(2,3);
	B(3,0) = -A(3,0); B(3,1) = -A(3,1); B(3,2) = -A(3,2); B(3,3) = -A(3,3);

    return B;
  }